

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi_batching(void)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  secp256k1_scratch *psVar2;
  size_t scratch_size_1;
  size_t scratch_size;
  int bucket_window;
  secp256k1_gej ptgj;
  secp256k1_ge ptg;
  secp256k1_scratch *scratch;
  int i;
  ecmult_multi_data data;
  secp256k1_gej r2;
  secp256k1_gej r;
  secp256k1_ge *pt;
  secp256k1_scalar *sc;
  secp256k1_scalar scG;
  secp256k1_scalar *in_stack_000005d8;
  secp256k1_scalar *in_stack_000005e0;
  secp256k1_gej *in_stack_000005e8;
  secp256k1_gej *in_stack_000005f0;
  secp256k1_gej *in_stack_fffffffffffffda8;
  secp256k1_scratch *psVar3;
  secp256k1_gej *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  secp256k1_callback *size;
  secp256k1_callback *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined1 local_1a8 [56];
  void *in_stack_fffffffffffffe90;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffe98;
  secp256k1_scalar *in_stack_fffffffffffffea0;
  secp256k1_gej *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb8;
  int iVar4;
  size_t in_stack_fffffffffffffed0;
  secp256k1_fe *in_stack_ffffffffffffff58;
  secp256k1_gej *in_stack_ffffffffffffff60;
  secp256k1_gej *in_stack_ffffffffffffff68;
  secp256k1_gej *in_stack_ffffffffffffff70;
  
  __ptr = checked_malloc((secp256k1_callback *)in_stack_fffffffffffffdb0,
                         (size_t)in_stack_fffffffffffffda8);
  __ptr_00 = checked_malloc((secp256k1_callback *)in_stack_fffffffffffffdb0,
                            (size_t)in_stack_fffffffffffffda8);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x13f464);
  random_scalar_order((secp256k1_scalar *)
                      CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  secp256k1_ecmult(in_stack_000005f0,in_stack_000005e8,in_stack_000005e0,in_stack_000005d8);
  for (iVar4 = 0; iVar4 < 0xb0; iVar4 = iVar4 + 1) {
    random_group_element_test
              ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    secp256k1_gej_set_ge(in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
    memcpy((void *)((long)__ptr_00 + (long)iVar4 * 0x58),local_1a8,0x58);
    random_scalar_order((secp256k1_scalar *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    secp256k1_ecmult(in_stack_000005f0,in_stack_000005e8,in_stack_000005e0,in_stack_000005d8);
    secp256k1_gej_add_var
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
  }
  secp256k1_gej_neg(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  psVar2 = secp256k1_scratch_create(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  psVar3 = (secp256k1_scratch *)0xb0;
  iVar1 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)CONCAT44(iVar4,in_stack_fffffffffffffeb8),psVar2,
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14cf,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
           );
    abort();
  }
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x13f66a);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14d1,"test condition failed: secp256k1_gej_is_infinity(&r)");
    abort();
  }
  secp256k1_scratch_destroy((secp256k1_callback *)in_stack_fffffffffffffdb0,psVar3);
  size = &CTX->error_callback;
  secp256k1_pippenger_scratch_size(1,1);
  psVar2 = secp256k1_scratch_create(in_stack_fffffffffffffdc0,(size_t)size);
  psVar3 = (secp256k1_scratch *)0xb0;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)CONCAT44(iVar4,in_stack_fffffffffffffeb8),psVar2,
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
  if (iVar4 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14d8,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
           );
    abort();
  }
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  iVar4 = secp256k1_gej_is_infinity((secp256k1_gej *)0x13f7bc);
  if (iVar4 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x14da,"test condition failed: secp256k1_gej_is_infinity(&r)");
    abort();
  }
  secp256k1_scratch_destroy((secp256k1_callback *)in_stack_fffffffffffffdb0,psVar3);
  iVar4 = 1;
  while( true ) {
    if (0xb0 < iVar4) {
      free(__ptr);
      free(__ptr_00);
      return;
    }
    if (iVar4 < 0x59) {
      in_stack_fffffffffffffdc0 = (secp256k1_callback *)secp256k1_strauss_scratch_size((long)iVar4);
      psVar2 = secp256k1_scratch_create(in_stack_fffffffffffffdc0,(size_t)size);
    }
    else {
      iVar1 = secp256k1_pippenger_bucket_window((long)iVar4);
      secp256k1_pippenger_scratch_size((long)iVar4,iVar1);
      psVar2 = secp256k1_scratch_create(in_stack_fffffffffffffdc0,(size_t)size);
    }
    psVar3 = (secp256k1_scratch *)0xb0;
    iVar1 = secp256k1_ecmult_multi_var
                      ((secp256k1_callback *)CONCAT44(iVar4,in_stack_fffffffffffffeb8),psVar2,
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                       ,in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
    if (iVar1 == 0) break;
    secp256k1_gej_add_var
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x13f97f);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x14e8,"test condition failed: secp256k1_gej_is_infinity(&r)");
      abort();
    }
    secp256k1_scratch_destroy((secp256k1_callback *)in_stack_fffffffffffffdb0,psVar3);
    iVar4 = iVar4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x14e6,
          "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
         );
  abort();
}

Assistant:

static void test_ecmult_multi_batching(void) {
    static const int n_points = 2*ECMULT_PIPPENGER_THRESHOLD;
    secp256k1_scalar scG;
    secp256k1_scalar *sc = (secp256k1_scalar *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_scalar) * n_points);
    secp256k1_ge *pt = (secp256k1_ge *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_ge) * n_points);
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;
    int i;
    secp256k1_scratch *scratch;

    secp256k1_gej_set_infinity(&r2);

    /* Get random scalars and group elements and compute result */
    random_scalar_order(&scG);
    secp256k1_ecmult(&r2, &r2, &secp256k1_scalar_zero, &scG);
    for(i = 0; i < n_points; i++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        random_group_element_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[i] = ptg;
        random_scalar_order(&sc[i]);
        secp256k1_ecmult(&ptgj, &ptgj, &sc[i], NULL);
        secp256k1_gej_add_var(&r2, &r2, &ptgj, NULL);
    }
    data.sc = sc;
    data.pt = pt;
    secp256k1_gej_neg(&r2, &r2);

    /* Test with empty scratch space. It should compute the correct result using
     * ecmult_mult_simple algorithm which doesn't require a scratch space. */
    scratch = secp256k1_scratch_create(&CTX->error_callback, 0);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
    secp256k1_gej_add_var(&r, &r, &r2, NULL);
    CHECK(secp256k1_gej_is_infinity(&r));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    /* Test with space for 1 point in pippenger. That's not enough because
     * ecmult_multi selects strauss which requires more memory. It should
     * therefore select the simple algorithm. */
    scratch = secp256k1_scratch_create(&CTX->error_callback, secp256k1_pippenger_scratch_size(1, 1) + PIPPENGER_SCRATCH_OBJECTS*ALIGNMENT);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
    secp256k1_gej_add_var(&r, &r, &r2, NULL);
    CHECK(secp256k1_gej_is_infinity(&r));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    for(i = 1; i <= n_points; i++) {
        if (i > ECMULT_PIPPENGER_THRESHOLD) {
            int bucket_window = secp256k1_pippenger_bucket_window(i);
            size_t scratch_size = secp256k1_pippenger_scratch_size(i, bucket_window);
            scratch = secp256k1_scratch_create(&CTX->error_callback, scratch_size + PIPPENGER_SCRATCH_OBJECTS*ALIGNMENT);
        } else {
            size_t scratch_size = secp256k1_strauss_scratch_size(i);
            scratch = secp256k1_scratch_create(&CTX->error_callback, scratch_size + STRAUSS_SCRATCH_OBJECTS*ALIGNMENT);
        }
        CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
        secp256k1_gej_add_var(&r, &r, &r2, NULL);
        CHECK(secp256k1_gej_is_infinity(&r));
        secp256k1_scratch_destroy(&CTX->error_callback, scratch);
    }
    free(sc);
    free(pt);
}